

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

BOOL __thiscall
Js::SmallSpanSequence::GetRangeAt
          (SmallSpanSequence *this,int index,SmallSpanSequenceIter *iter,int *pCountOfMissed,
          StatementData *data)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  GrowingUint32HeapArray *pGVar5;
  uint uVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  pGVar5 = this->pStatementBuffer;
  uVar8 = pGVar5->count;
  if (uVar8 <= (uint)index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x154f,"((uint32)index < pStatementBuffer->Count())",
                                "(uint32)index < pStatementBuffer->Count()");
    if (!bVar3) goto LAB_006d2065;
    *puVar4 = 0;
    pGVar5 = this->pStatementBuffer;
    uVar8 = pGVar5->count;
  }
  iVar10 = 0;
  uVar9 = 0;
  sVar7 = 0;
  if ((uint)index < uVar8) {
    uVar9 = pGVar5->buffer[(uint)index];
    sVar7 = (short)(uVar9 >> 0x10);
    if (uVar9 >> 0x10 != 0x7fff) goto LAB_006d1eda;
    pGVar5 = this->pActualOffsetList;
    if (pGVar5 == (GrowingUint32HeapArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1558,"(this->pActualOffsetList)","this->pActualOffsetList");
      if (!bVar3) goto LAB_006d2065;
      *puVar4 = 0;
      pGVar5 = this->pActualOffsetList;
    }
    uVar6 = pGVar5->count;
    if (uVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1559,"(this->pActualOffsetList->Count() > 0)",
                                  "this->pActualOffsetList->Count() > 0");
      if (!bVar3) goto LAB_006d2065;
      *puVar4 = 0;
      pGVar5 = this->pActualOffsetList;
      uVar6 = pGVar5->count;
    }
    uVar1 = iter->indexOfActualOffset;
    if (uVar6 <= uVar1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x155a,
                                  "(this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset)"
                                  ,
                                  "this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset"
                                 );
      if (!bVar3) goto LAB_006d2065;
      *puVar4 = 0;
      pGVar5 = this->pActualOffsetList;
      uVar1 = iter->indexOfActualOffset;
      uVar6 = pGVar5->count;
    }
    iVar10 = 1;
    uVar8 = 0;
    if (uVar1 < uVar6) {
      uVar8 = pGVar5->buffer[uVar1];
    }
  }
  else {
LAB_006d1eda:
    uVar8 = (int)sVar7 + iter->accumulatedSourceBegin;
  }
  data->sourceBegin = uVar8;
  if ((short)uVar9 == 0x7fff) {
    pGVar5 = this->pActualOffsetList;
    if (pGVar5 == (GrowingUint32HeapArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1567,"(this->pActualOffsetList)","this->pActualOffsetList");
      if (!bVar3) goto LAB_006d2065;
      *puVar4 = 0;
      pGVar5 = this->pActualOffsetList;
    }
    uVar8 = pGVar5->count;
    if (uVar8 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1568,"(this->pActualOffsetList->Count() > 0)",
                                  "this->pActualOffsetList->Count() > 0");
      if (!bVar3) goto LAB_006d2065;
      *puVar4 = 0;
      pGVar5 = this->pActualOffsetList;
      uVar8 = pGVar5->count;
    }
    uVar9 = iter->indexOfActualOffset + iVar10;
    if (uVar8 <= uVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1569,
                                  "(this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed))"
                                  ,
                                  "this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed)"
                                 );
      if (!bVar3) {
LAB_006d2065:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      pGVar5 = this->pActualOffsetList;
      uVar8 = pGVar5->count;
      uVar9 = iter->indexOfActualOffset + iVar10;
    }
    uVar6 = 0;
    if (uVar9 < uVar8) {
      uVar6 = pGVar5->buffer[uVar9];
    }
    data->bytecodeBegin = uVar6;
    iVar10 = iVar10 + 1;
  }
  else {
    data->bytecodeBegin = (uVar9 & 0xffff) + iter->accumulatedBytecodeBegin;
  }
  if (pCountOfMissed != (int *)0x0) {
    *pCountOfMissed = iVar10;
  }
  return 1;
}

Assistant:

BOOL SmallSpanSequence::GetRangeAt(int index, SmallSpanSequenceIter &iter, int * pCountOfMissed, StatementData & data)
    {
        Assert((uint32)index < pStatementBuffer->Count());

        SmallSpan span(pStatementBuffer->ItemInBuffer((uint32)index));

        int countOfMissed = 0;

        if ((short)span.sourceBegin == SHRT_MAX)
        {
            // Look in ActualOffset store
            Assert(this->pActualOffsetList);
            Assert(this->pActualOffsetList->Count() > 0);
            Assert(this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset);

            data.sourceBegin = this->pActualOffsetList->ItemInBuffer((uint32)iter.indexOfActualOffset);
            countOfMissed++;
        }
        else
        {
            data.sourceBegin = iter.accumulatedSourceBegin + (short)span.sourceBegin;
        }

        if (span.bytecodeBegin == SHRT_MAX)
        {
            // Look in ActualOffset store
            Assert(this->pActualOffsetList);
            Assert(this->pActualOffsetList->Count() > 0);
            Assert(this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed));

            data.bytecodeBegin = this->pActualOffsetList->ItemInBuffer((uint32)iter.indexOfActualOffset + countOfMissed);
            countOfMissed++;
        }
        else
        {
            data.bytecodeBegin = iter.accumulatedBytecodeBegin + span.bytecodeBegin;
        }

        if (pCountOfMissed)
        {
            *pCountOfMissed = countOfMissed;
        }

        return TRUE;
    }